

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImTextCountCharsFromUtf8(char *in_text,char *in_text_end)

{
  int iVar1;
  int iVar2;
  uint c;
  uint local_2c;
  
  iVar2 = 0;
  if (in_text_end == (char *)0x0 || in_text < in_text_end) {
    iVar2 = 0;
    do {
      if (*in_text == '\0') {
        return iVar2;
      }
      iVar1 = ImTextCharFromUtf8(&local_2c,in_text,in_text_end);
      in_text = in_text + iVar1;
      iVar2 = iVar2 + 1;
    } while (in_text < in_text_end || in_text_end == (char *)0x0);
  }
  return iVar2;
}

Assistant:

int ImTextCountCharsFromUtf8(const char* in_text, const char* in_text_end)
{
    int char_count = 0;
    while ((!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        char_count++;
    }
    return char_count;
}